

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall
testing::internal::anon_unknown_38::PositiveAndNegativeUnitTestFilter::MatchesTest
          (PositiveAndNegativeUnitTestFilter *this,string *test_suite_name,string *test_name)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *test_name_local;
  string *test_suite_name_local;
  PositiveAndNegativeUnitTestFilter *this_local;
  
  local_20 = test_name;
  test_name_local = test_suite_name;
  test_suite_name_local = (string *)this;
  std::operator+(&local_60,test_suite_name,".");
  std::operator+(&local_40,&local_60,local_20);
  bVar1 = MatchesName(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return bVar1;
}

Assistant:

bool MatchesTest(const std::string& test_suite_name,
                   const std::string& test_name) const {
    return MatchesName(test_suite_name + "." + test_name);
  }